

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronized_timer.cpp
# Opt level: O0

void __thiscall
jessilib::synchonrized_callback::operator()(synchonrized_callback *this,timer *in_timer)

{
  bool bVar1;
  __int_type_conflict1 _Var2;
  cancel_detector local_20;
  cancel_detector detector;
  timer *in_timer_local;
  synchonrized_callback *this_local;
  
  detector.m_context = (cancel_token_context *)in_timer;
  cancel_detector::cancel_detector(&local_20,&this->m_cancel_token);
  _Var2 = std::__atomic_base<unsigned_int>::operator++
                    (&(this->m_calls).super___atomic_base<unsigned_int>);
  if (_Var2 == 1) {
    do {
      std::function<void_(jessilib::timer_&)>::operator()
                (&this->m_callback,(timer *)detector.m_context);
      bVar1 = cancel_detector::expired(&local_20);
      if (bVar1) break;
      _Var2 = std::__atomic_base<unsigned_int>::operator--
                        (&(this->m_calls).super___atomic_base<unsigned_int>);
    } while (_Var2 != 0);
  }
  cancel_detector::~cancel_detector(&local_20);
  return;
}

Assistant:

void operator()(timer& in_timer) {
		cancel_detector detector = m_cancel_token;
		// Iterate calls
		if (++m_calls == 1) {
			// No other calls were queued; this should be safe.
			do {
				m_callback(in_timer);

				// callback may have cancelled the timer (and thus destructed this callback); check
				if (detector.expired()) {
					// We cannot access any members of this struct outside of the stack; return immediately
					return;
				}
			}
			while (--m_calls != 0);
		}
	}